

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O3

int SPRKStepSetUseCompensatedSums(void *arkode_mem,int onoff)

{
  int iVar1;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeSPRKStepMem local_18;
  ARKodeMem local_10;
  
  local_10 = (ARKodeMem)0x0;
  local_18 = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessARKODEStepMem
                    (arkode_mem,"SPRKStepSetUseCompensatedSums",&local_10,&local_18);
  if (iVar1 == 0) {
    if (onoff == 0) {
      local_10->use_compensated_sums = 0;
      local_10->step = sprkStep_TakeStep;
    }
    else {
      local_10->use_compensated_sums = 1;
      local_10->step = sprkStep_TakeStep_Compensated;
      if ((local_18->yerr == (N_Vector)0x0) &&
         (iVar1 = arkAllocVec(local_10,local_10->yn,&local_18->yerr), iVar1 == 0)) {
        return -0x14;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int SPRKStepSetUseCompensatedSums(void* arkode_mem, sunbooleantype onoff)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (onoff)
  {
    ark_mem->use_compensated_sums = SUNTRUE;
    ark_mem->step                 = sprkStep_TakeStep_Compensated;
    if (!step_mem->yerr)
    {
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(step_mem->yerr)))
      {
        return ARK_MEM_FAIL;
      }
    }
  }
  else
  {
    ark_mem->use_compensated_sums = SUNFALSE;
    ark_mem->step                 = sprkStep_TakeStep;
  }

  return (retval);
}